

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O2

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)2,(CPU::MOS6502Esque::Type)5>::
disk_controller_did_change_paged_item
          (ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)2,(CPU::MOS6502Esque::Type)5>
           *this)

{
  DiskController *in_RSI;
  
  ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)2,_(CPU::MOS6502Esque::Type)5>::
  disk_controller_did_change_paged_item
            ((ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)2,_(CPU::MOS6502Esque::Type)5>
              *)(this + -0x108),in_RSI);
  return;
}

Assistant:

void disk_controller_did_change_paged_item(DiskController *controller) final {
			switch(controller->get_paged_item()) {
				default:
					ram_top_ = basic_visible_ram_top_;
					paged_rom_ = rom_.data();
				break;

				case DiskController::PagedItem::RAM:
					ram_top_ = basic_invisible_ram_top_;
				break;

				case DiskController::PagedItem::DiskROM:
					ram_top_ = uint16_t(0xffff - disk_rom_.size());
					paged_rom_ = disk_rom_.data();
				break;
			}
		}